

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::arraytype<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  bool bVar3;
  string_view expected;
  undefined1 local_b0 [8];
  Result<wasm::Ok> namedFields;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  string local_68;
  undefined1 local_48 [8];
  Result<wasm::Ok> _val;
  
  expected._M_str = "array";
  expected._M_len = 5;
  bVar3 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar3) {
    fields<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_b0,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_48,
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_b0);
    if (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ == '\x01') {
      namedFields.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = &local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)
                 ((long)&namedFields.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),local_48,
                 (undefined1 *)
                 (_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ + (long)local_48));
      puVar1 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
      if ((undefined8 *)
          namedFields.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ == &local_78) {
        *puVar1 = local_78;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) = uStack_70;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
             namedFields.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) = local_78;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) = local_80;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_48);
      bVar3 = Lexer::takeRParen(&ctx->in);
      if (bVar3) {
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\0';
      }
      else {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"expected end of array definition","");
        Lexer::err((Err *)local_48,&ctx->in,&local_68);
        puVar1 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar1;
        puVar2 = (undefined1 *)
                 ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 8);
        if (local_48 == (undefined1  [8])puVar2) {
          *puVar1 = CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_48;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_);
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
             _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._0_8_ = 0;
        _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_48 = (undefined1  [8])puVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_b0);
  }
  else {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::ArrayT> arraytype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("array"sv)) {
    return {};
  }
  auto namedFields = fields(ctx);
  CHECK_ERR(namedFields);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of array definition");
  }

  if (auto array = ctx.makeArray(*namedFields)) {
    return *array;
  }
  return ctx.in.err("expected exactly one field in array definition");
}